

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O1

Gia_Man_t * Gia_ManDupNormalize(Gia_Man_t *p,int fHashMapping)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  uint uVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pName = pcVar8;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pSpec = pcVar8;
  p->pObjs->Value = 0;
  if ((0 < p->nRegs) && ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0)) {
    iVar5 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime);
    if (0 < iVar5) {
      uVar6 = Tim_ManPiNum((Tim_Man_t *)p->pManTime);
      iVar5 = Tim_ManCiNum((Tim_Man_t *)p->pManTime);
      if (iVar5 != p->vCis->nSize) {
        __assert_fail("nAll == Gia_ManCiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                      ,0xa1,"Gia_Man_t *Gia_ManDupNormalize(Gia_Man_t *, int)");
      }
      uVar13 = uVar6 - p->nRegs;
      if ((int)uVar13 < 1) {
        __assert_fail("nPis > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                      ,0xa2,"Gia_Man_t *Gia_ManDupNormalize(Gia_Man_t *, int)");
      }
      uVar14 = 0;
      do {
        pGVar9 = Gia_ManAppendObj(p_00);
        uVar3 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar3 | 0x9fffffff;
        *(ulong *)pGVar9 =
             uVar3 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) goto LAB_00231bf2;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_00->pObjs;
        if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) goto LAB_00231bf2;
        if ((long)p->vCis->nSize <= (long)uVar14) goto LAB_00231c30;
        iVar1 = p->vCis->pArray[uVar14];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00231c11;
        p->pObjs[iVar1].Value = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
      if ((int)uVar6 < iVar5) {
        uVar14 = (ulong)uVar6;
        do {
          pGVar9 = Gia_ManAppendObj(p_00);
          uVar3 = *(ulong *)pGVar9;
          *(ulong *)pGVar9 = uVar3 | 0x9fffffff;
          *(ulong *)pGVar9 =
               uVar3 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p_00->pObjs;
          if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) goto LAB_00231bf2;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_00->pObjs;
          if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) goto LAB_00231bf2;
          if (((int)uVar6 < 0) || (p->vCis->nSize <= (int)uVar14)) goto LAB_00231c30;
          iVar1 = p->vCis->pArray[uVar14];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00231c11;
          p->pObjs[iVar1].Value = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
          uVar14 = uVar14 + 1;
        } while ((int)uVar14 < iVar5);
      }
      if (0 < p->nRegs) {
        uVar13 = uVar6 - p->nRegs;
        uVar14 = (ulong)uVar13;
        do {
          pGVar9 = Gia_ManAppendObj(p_00);
          uVar3 = *(ulong *)pGVar9;
          *(ulong *)pGVar9 = uVar3 | 0x9fffffff;
          *(ulong *)pGVar9 =
               uVar3 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p_00->pObjs;
          if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) {
LAB_00231bf2:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_00->pObjs;
          if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) goto LAB_00231bf2;
          if (((int)uVar13 < 0) || (p->vCis->nSize <= (int)uVar14)) {
LAB_00231c30:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar5 = p->vCis->pArray[uVar14];
          if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00231c11;
          p->pObjs[iVar5].Value = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
          uVar14 = uVar14 + 1;
        } while ((int)uVar14 < (int)uVar6);
      }
      puts("Warning: Shuffled CI order to be correct sequential AIG.");
      goto LAB_002319ce;
    }
  }
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar15 = 0;
    do {
      iVar5 = pVVar11->pArray[lVar15];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00231c11;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar14 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar14 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar14 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar9 = p_00->pObjs;
      if ((pGVar10 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar10)) goto LAB_00231bf2;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar9) >> 2) * -0x55555555);
      pGVar9 = p_00->pObjs;
      if ((pGVar10 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar10)) goto LAB_00231bf2;
      pGVar4[iVar5].Value = (int)((ulong)((long)pGVar10 - (long)pGVar9) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
      pVVar11 = p->vCis;
    } while (lVar15 < pVVar11->nSize);
  }
LAB_002319ce:
  if (fHashMapping != 0) {
    Gia_ManHashAlloc(p_00);
  }
  if (0 < p->nObjs) {
    lVar16 = 8;
    lVar15 = 0;
    do {
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar14 = *(ulong *)((long)pGVar4 + lVar16 + -8);
      uVar6 = (uint)uVar14;
      if ((uVar14 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar6) {
        uVar13 = *(uint *)((long)pGVar4 +
                          lVar16 + (ulong)(uint)((int)(uVar14 & 0x1fffffff) << 2) * -3);
        uVar12 = (uint)(uVar14 >> 0x20);
        if ((((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) ||
           ((uVar6 & 0x1fffffff) != (uVar12 & 0x1fffffff))) {
          if (fHashMapping == 0) {
            if (((int)uVar13 < 0) ||
               (uVar6 = *(uint *)((long)pGVar4 + lVar16 + (ulong)((uVar12 & 0x1fffffff) << 2) * -3),
               (int)uVar6 < 0)) goto LAB_00231c4f;
            iVar5 = Gia_ManAppendAnd(p_00,uVar13 ^ (uint)(uVar14 >> 0x1d) & 1,
                                     uVar6 ^ uVar12 >> 0x1d & 1);
          }
          else {
            if (((int)uVar13 < 0) ||
               (uVar6 = *(uint *)((long)pGVar4 + lVar16 + (ulong)((uVar12 & 0x1fffffff) << 2) * -3),
               (int)uVar6 < 0)) goto LAB_00231c4f;
            iVar5 = Gia_ManHashAnd(p_00,uVar13 ^ (uint)(uVar14 >> 0x1d) & 1,
                                   uVar6 ^ uVar12 >> 0x1d & 1);
          }
        }
        else {
          if ((int)uVar13 < 0) goto LAB_00231c4f;
          iVar5 = Gia_ManAppendBuf(p_00,uVar13 ^ uVar6 >> 0x1d & 1);
        }
        *(int *)(&pGVar4->field_0x0 + lVar16) = iVar5;
      }
      lVar15 = lVar15 + 1;
      lVar16 = lVar16 + 0xc;
    } while (lVar15 < p->nObjs);
  }
  if (fHashMapping != 0) {
    Gia_ManHashStop(p_00);
  }
  pVVar11 = p->vCos;
  if (0 < pVVar11->nSize) {
    lVar15 = 0;
    do {
      iVar5 = pVVar11->pArray[lVar15];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_00231c11:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar5;
      if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0) {
LAB_00231c4f:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar6 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
                                   pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value)
      ;
      pGVar4->Value = uVar6;
      lVar15 = lVar15 + 1;
      pVVar11 = p->vCos;
    } while (lVar15 < pVVar11->nSize);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  p_00->nConstrs = p->nConstrs;
  iVar5 = Gia_ManIsNormalized(p_00);
  if (iVar5 != 0) {
    Gia_ManDupRemapEquiv(p_00,p);
    return p_00;
  }
  __assert_fail("Gia_ManIsNormalized(pNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                ,0xbb,"Gia_Man_t *Gia_ManDupNormalize(Gia_Man_t *, int)");
}

Assistant:

Gia_Man_t * Gia_ManDupNormalize( Gia_Man_t * p, int fHashMapping )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    if ( !Gia_ManIsSeqWithBoxes(p) )
    {
        Gia_ManForEachCi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi(pNew);
    }
    else
    {
        // current CI order:  PIs + FOs + NewCIs
        // desired reorder:   PIs + NewCIs + FOs
        int nCIs = Tim_ManPiNum( (Tim_Man_t *)p->pManTime );
        int nAll = Tim_ManCiNum( (Tim_Man_t *)p->pManTime );
        int nPis = nCIs - Gia_ManRegNum(p);
        assert( nAll == Gia_ManCiNum(p) );
        assert( nPis > 0 );
        // copy PIs first
        for ( i = 0; i < nPis; i++ )
            Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
       // copy new CIs second
        for ( i = nCIs; i < nAll; i++ )
            Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
        // copy flops last
        for ( i = nCIs - Gia_ManRegNum(p); i < nCIs; i++ )
            Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
        printf( "Warning: Shuffled CI order to be correct sequential AIG.\n" );
    }
    if ( fHashMapping ) Gia_ManHashAlloc( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( fHashMapping )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    if ( fHashMapping ) Gia_ManHashStop( pNew );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew->nConstrs = p->nConstrs;
    assert( Gia_ManIsNormalized(pNew) );
    Gia_ManDupRemapEquiv( pNew, p );
    return pNew;
}